

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  uint tag;
  char cVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = num * 8;
  tag = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    uVar4 = (ulong)tag;
    cVar3 = (char)this->unknown_;
    if (0x7f < uVar5) {
      do {
        std::__cxx11::string::push_back(cVar3);
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar4 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar3);
  }
  pcVar2 = ParseContext::ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
                     (ctx,this,ptr,tag);
  if ((pcVar2 != (char *)0x0) && (this->unknown_ != (string *)0x0)) {
    uVar4 = (ulong)(uVar5 | 4);
    cVar3 = (char)this->unknown_;
    if (0x7f < uVar5) {
      do {
        std::__cxx11::string::push_back(cVar3);
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar4 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar3);
  }
  return pcVar2;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }